

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall FloatInstance::FloatInstance(FloatInstance *this,string *value)

{
  bool bVar1;
  undefined8 *puVar2;
  double dVar3;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Float","");
  Instance::Instance(&this->super_Instance,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_Instance)._vptr_Instance = (_func_int **)&PTR__CharacterInstance_0016de58;
  bVar1 = Grammar::is_float_value(value);
  if (bVar1) {
    dVar3 = atof((value->_M_dataplus)._M_p);
    this->_value = (float)dVar3;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

FloatInstance::FloatInstance(const std::string& value) : Instance("Float") {
    if (!Grammar::is_float_value(value))
        throw EXC_INVALID_ARGUMENT;
    _value = atof(value.c_str());
}